

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlNodeCountOnesRealVec(Ssw_Sml_t *p,Vec_Ptr_t *vObjs)

{
  uint uWord;
  void *pvVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = vObjs->nSize;
  if (iVar6 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = (ulong)(uint)p->nWordsTotal;
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < (int)uVar4; lVar3 = lVar3 + 1) {
      uWord = 0;
      for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + 1) {
        pvVar1 = Vec_PtrEntry(vObjs,iVar5);
        uVar4 = (ulong)p->nWordsTotal;
        uWord = -(((uint)pvVar1 ^ *(uint *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
                ^ *(uint *)((long)&p[1].pAig +
                           (long)*(int *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x24) * uVar4 * 4 +
                           lVar3 * 4) | uWord;
        iVar6 = vObjs->nSize;
      }
      iVar5 = Aig_WordCountOnes(uWord);
      iVar2 = iVar2 + iVar5;
    }
  }
  return iVar2;
}

Assistant:

int Ssw_SmlNodeCountOnesRealVec( Ssw_Sml_t * p, Vec_Ptr_t * vObjs )
{
    Aig_Obj_t * pObj;
    unsigned * pSims, uWord;
    int i, k, Counter = 0;
    if ( Vec_PtrSize(vObjs) == 0 )
        return 0;
    for ( i = 0; i < p->nWordsTotal; i++ )
    {
        uWord = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, k )
        {
            pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
            if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
                uWord |= ~pSims[i];
            else
                uWord |= pSims[i];
        }
        Counter += Aig_WordCountOnes( uWord );
    }
    return Counter;
}